

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O2

LispPTR * fixp_value(LispPTR *ptr)

{
  uint LAddr;
  LispPTR LAddr_00;
  LispPTR *pLVar1;
  
  LAddr = *ptr;
  if (LAddr < 0xfffff) {
    LAddr_00 = N_OP_createcell(0xe0002);
    pLVar1 = NativeAligned4FromLAddr(LAddr_00);
    *pLVar1 = LAddr & 0xffff;
    *ptr = LAddr_00;
    if ((-1 < *(short *)((ulong)(LAddr_00 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(LAddr_00,0);
      }
      else {
        htfind(LAddr_00,0);
      }
    }
    return pLVar1;
  }
  pLVar1 = NativeAligned4FromLAddr(LAddr);
  return pLVar1;
}

Assistant:

LispPTR *fixp_value(LispPTR *ptr) {
  LispPTR val = *ptr;

  if (val < (S_NEGATIVE | 0xFFFF)) {
    LispPTR newval = N_OP_createcell(S_POSITIVE | TYPE_FIXP);
    LispPTR *newcell;
    newcell = (LispPTR *)NativeAligned4FromLAddr(newval);
    *newcell = val & 0xFFFF; /* it was smallp, so fill in */
    *ptr = newval;
    GCLOOKUP(newval, ADDREF); /* so it has a refcount */
    return ((LispPTR *)newcell);
  }
  return ((LispPTR *)NativeAligned4FromLAddr(val));
}